

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O1

btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
 __thiscall
phmap::priv::
base_checker<phmap::btree_set<std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
::
iter_check<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,false>>const,std::__cxx11::string_const&,std::__cxx11::string_const*>,std::_Rb_tree_const_iterator<std::__cxx11::string>>
          (base_checker<phmap::btree_set<std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
           *this,btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                 tree_iter,
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          checker_iter)

{
  const_iterator cVar1;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  bVar2;
  
  cVar1 = btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
          ::end((btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
                 *)this);
  if (cVar1.position == tree_iter.position && cVar1.node == tree_iter.node) {
    if ((_Base_ptr)(this + 0x28) != checker_iter._M_node) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                    ,0x7d,
                    "IterType phmap::priv::base_checker<phmap::btree_set<std::basic_string<char>>, std::set<std::basic_string<char>>>::iter_check(IterType, CheckerIterType) const [TreeType = phmap::btree_set<std::basic_string<char>>, CheckerType = std::set<std::basic_string<char>>, IterType = phmap::priv::btree_iterator<const phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::Less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, false>>, const std::basic_string<char> &, const std::basic_string<char> *>, CheckerIterType = std::_Rb_tree_const_iterator<std::basic_string<char>>]"
                   );
    }
  }
  else {
    if (((undefined1  [16])tree_iter & (undefined1  [16])0x7) != (undefined1  [16])0x0) {
      __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                    ,0xf84,
                    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::Less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, false>> *, unsigned char, std::basic_string<char>, phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::Less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::Less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, false>> *, unsigned char, std::basic_string<char>, phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::Less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
                   );
    }
    (anonymous_namespace)::CheckPairEquals<std::__cxx11::string,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (tree_iter.node + (long)tree_iter.position * 0x20 + 0x10),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (checker_iter._M_node + 1));
  }
  bVar2._12_4_ = 0;
  bVar2.node = (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
                *)SUB128(tree_iter._0_12_,0);
  bVar2.position = SUB124(tree_iter._0_12_,8);
  return bVar2;
}

Assistant:

IterType iter_check(IterType tree_iter, CheckerIterType checker_iter) const {
        if (tree_iter == tree_.end()) {
            PHMAP_INTERNAL_CHECK(checker_iter == checker_.end(),
                                 "Checker iterator not at end.");
        } else {
            CheckPairEquals(*tree_iter, *checker_iter);
        }
        return tree_iter;
    }